

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonAfterEditSizeAdjust(JsonParse *pParse,u32 iRoot)

{
  u32 uVar1;
  int iVar2;
  long in_FS_OFFSET;
  u32 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  uVar1 = pParse->nBlob;
  pParse->nBlob = pParse->nBlobAlloc;
  jsonbPayloadSize(pParse,iRoot,&local_2c);
  pParse->nBlob = uVar1;
  iVar2 = jsonBlobChangePayloadSize(pParse,iRoot,local_2c + pParse->delta);
  pParse->delta = pParse->delta + iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonAfterEditSizeAdjust(JsonParse *pParse, u32 iRoot){
  u32 sz = 0;
  u32 nBlob;
  assert( pParse->delta!=0 );
  assert( pParse->nBlobAlloc >= pParse->nBlob );
  nBlob = pParse->nBlob;
  pParse->nBlob = pParse->nBlobAlloc;
  (void)jsonbPayloadSize(pParse, iRoot, &sz);
  pParse->nBlob = nBlob;
  sz += pParse->delta;
  pParse->delta += jsonBlobChangePayloadSize(pParse, iRoot, sz);
}